

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_rangeproof_info
              (secp256k1_context *ctx,int *exp,int *mantissa,uint64_t *min_value,uint64_t *max_value
              ,uchar *proof,size_t plen)

{
  int iVar1;
  uint64_t scale;
  size_t offset;
  
  if (proof == (uchar *)0x0) {
    (*(ctx->illegal_callback).fn)("proof != NULL",(ctx->illegal_callback).data);
    iVar1 = 0;
  }
  else {
    offset = 0;
    scale = 1;
    iVar1 = secp256k1_rangeproof_getheader_impl
                      (&offset,exp,mantissa,&scale,min_value,max_value,proof,plen);
  }
  return iVar1;
}

Assistant:

int secp256k1_rangeproof_info(const secp256k1_context* ctx, int *exp, int *mantissa,
 uint64_t *min_value, uint64_t *max_value, const unsigned char *proof, size_t plen) {
    size_t offset;
    uint64_t scale;
    ARG_CHECK(exp != NULL);
    ARG_CHECK(mantissa != NULL);
    ARG_CHECK(min_value != NULL);
    ARG_CHECK(max_value != NULL);
    ARG_CHECK(proof != NULL);
    offset = 0;
    scale = 1;
    (void)ctx;
    return secp256k1_rangeproof_getheader_impl(&offset, exp, mantissa, &scale, min_value, max_value, proof, plen);
}